

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgflusher.cc
# Opt level: O1

void * bgflusher_thread(void *voidargs)

{
  filemgr *file;
  err_log_callback *log_callback;
  bool bVar1;
  uint8_t uVar2;
  avl_node *node;
  avl_node *paVar3;
  uint64_t uVar4;
  long lVar5;
  bool bVar6;
  filemgr_open_result fVar7;
  timespec ts;
  
LAB_00106d0b:
  do {
    pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
    node = avl_first(&openfiles);
    if (node == (avl_node *)0x0) {
      bVar6 = true;
    }
    else {
      lVar5 = 0;
      do {
        file = (filemgr *)node[-0xc].right;
        if (file == (filemgr *)0x0) {
          paVar3 = avl_next(node);
          avl_remove(&openfiles,node);
          free(node + -0x36);
          bVar6 = false;
          bVar1 = false;
        }
        else {
          if (*(char *)((long)&node[-1].left + 4) == '\x01') {
            paVar3 = avl_next(node);
          }
          else {
            *(undefined1 *)((long)&node[-1].left + 4) = 1;
            log_callback = (err_log_callback *)node[-1].right;
            fVar7 = filemgr_open(file->filename,file->ops,file->config,log_callback);
            pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
            if (fVar7.rv == FDB_RESULT_SUCCESS) {
              uVar4 = filemgr_flush_immutable(file,log_callback);
              lVar5 = lVar5 + uVar4;
              filemgr_close(file,false,file->filename,log_callback);
            }
            else {
              fdb_log_impl(log_callback,2,fVar7.rv,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/bgflusher.cc"
                           ,"bgflusher_thread",0x7f,
                           "Failed to open the file \'%s\' for background flushing\n.",
                           file->filename);
            }
            pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
            *(undefined1 *)((long)&node[-1].left + 4) = 0;
            paVar3 = avl_next(node);
            if (bgflusher_terminate_signal != '\0') {
              pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
              bVar6 = true;
              bVar1 = false;
              goto LAB_00106e47;
            }
          }
          bVar6 = false;
          bVar1 = true;
        }
LAB_00106e47:
        if (bVar6) {
          if (!bVar1) {
            return (void *)0x0;
          }
          goto LAB_00106d0b;
        }
        node = paVar3;
      } while (paVar3 != (avl_node *)0x0);
      bVar6 = lVar5 == 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
    pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
    if (bgflusher_terminate_signal != '\0') {
      pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
      return (void *)0x0;
    }
    if (bVar6) {
      ts = convert_reltime_to_abstime(2000);
      pthread_cond_timedwait
                ((pthread_cond_t *)&sync_cond,(pthread_mutex_t *)&sync_mutex,(timespec *)&ts);
    }
    uVar2 = bgflusher_terminate_signal;
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    if (uVar2 != '\0') {
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

static void * bgflusher_thread(void *voidargs)
{
    fdb_status fs;
    struct avl_node *a;
    struct filemgr *file;
    struct openfiles_elem *elem;
    err_log_callback *log_callback = NULL;

    while (1) {
        uint64_t num_blocks = 0;

        mutex_lock(&bgf_lock);
        a = avl_first(&openfiles);
        while(a) {
            filemgr_open_result ffs;
            elem = _get_entry(a, struct openfiles_elem, avl);
            file = elem->file;
            if (!file) {
                a = avl_next(a);
                avl_remove(&openfiles, &elem->avl);
                free(elem);
                continue;
            }

            if (elem->background_flush_in_progress) {
                a = avl_next(a);
            } else {
                elem->background_flush_in_progress = true;
                log_callback = elem->log_callback;
                ffs = filemgr_open(file->filename, file->ops,
                        file->config, log_callback);
                fs = (fdb_status)ffs.rv;
                mutex_unlock(&bgf_lock);
                if (fs == FDB_RESULT_SUCCESS) {
                    num_blocks += filemgr_flush_immutable(file,
                                                          log_callback);
                    filemgr_close(file, 0, file->filename, log_callback);

                } else {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Failed to open the file '%s' for background flushing\n.",
                            file->filename);
                }
                mutex_lock(&bgf_lock);
                elem->background_flush_in_progress = false;
                a = avl_next(&elem->avl);
                if (bgflusher_terminate_signal) {
                    mutex_unlock(&bgf_lock);
                    return NULL;
                }
            }
        }
        mutex_unlock(&bgf_lock);

        mutex_lock(&sync_mutex);
        if (bgflusher_terminate_signal) {
            mutex_unlock(&sync_mutex);
            break;
        }
        if (!num_blocks) {
            thread_cond_timedwait(&sync_cond, &sync_mutex,
                                  (unsigned)(sleep_duration * 1000));
        }
        if (bgflusher_terminate_signal) {
            mutex_unlock(&sync_mutex);
            break;
        }
        mutex_unlock(&sync_mutex);
    }
    return NULL;
}